

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O2

char * HPDF_StrStr(char *s1,char *s2,HPDF_UINT maxlen)

{
  HPDF_UINT n;
  HPDF_INT HVar1;
  HPDF_UINT HVar2;
  
  n = HPDF_StrLen(s2,-1);
  if (s1 != (char *)0x0) {
    if (n == 0) {
      return s1;
    }
    if (maxlen == 0) {
      maxlen = HPDF_StrLen(s1,-1);
    }
    if (n <= maxlen) {
      for (HVar2 = maxlen + 1; n != HVar2; HVar2 = HVar2 - 1) {
        HVar1 = HPDF_MemCmp((HPDF_BYTE *)s1,(HPDF_BYTE *)s2,n);
        if (HVar1 == 0) {
          return (char *)(HPDF_BYTE *)s1;
        }
        s1 = (char *)((HPDF_BYTE *)s1 + 1);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char*
HPDF_StrStr  (const char   *s1,
              const char   *s2,
              HPDF_UINT     maxlen)
{
    HPDF_UINT len = HPDF_StrLen (s2, -1);

    if (!s1)
        return NULL;

    if (len == 0)
        return s1;

    if (maxlen == 0)
        maxlen = HPDF_StrLen (s1, -1);

    if (maxlen < len)
        return NULL;

    maxlen -= len;
    maxlen++;

    while (maxlen > 0) {
        if (HPDF_MemCmp ((HPDF_BYTE *)s1, (HPDF_BYTE *)s2, len) == 0)
            return s1;

        s1++;
        maxlen--;
    }

    return NULL;
}